

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_level_test.c
# Opt level: O1

int main(void)

{
  pvip_t *pvip;
  PVIPString *str;
  PVIPNode *pPVar1;
  char *__s;
  
  C = 0;
  puts("1..3");
  pvip = pvip_new();
  str = PVIP_string_new();
  str->buflen = 1;
  PVIP_string_printf(str,"%d",1);
  if ((str->len == 1) && (*str->buf == '1')) {
    puts("ok 1");
  }
  else {
    puts("not ok 1");
    printf("# len: %ld\n",str->len);
    printf("# char[0]: %x\n",(ulong)(uint)(int)*str->buf);
  }
  PVIP_string_printf(str,"%s%d","hoge");
  if ((str->len == 6) &&
     ((short)*(int *)((long)str->buf + 4) == 0x3265 && *(int *)str->buf == 0x676f6831)) {
    puts("ok 2");
  }
  else {
    puts("not ok 2");
    printf("# len: %ld\n",str->len);
  }
  PVIP_string_destroy(str);
  pPVar1 = PVIP_parse_string(pvip,"\n",1,0,(PVIPString **)0x0);
  __s = "ok 3";
  if (pPVar1 == (PVIPNode *)0x0) {
    __s = "not ok 3";
  }
  puts(__s);
  pvip_free(pvip);
  return 0;
}

Assistant:

int main() {
    C=0;
    printf("1..3\n");

    pvip_t* pvip = pvip_new();

    {
        PVIPString * x = PVIP_string_new();
        x->buflen = 1; // shorten buffer length for testing

        PVIP_string_printf(x, "%d", 1);
        if (x->len==1 && memcmp(x->buf, "1", 1)==0) {
            printf("ok 1\n");
        } else {
            printf("not ok 1\n");
            printf("# len: %ld\n", x->len);
            printf("# char[0]: %x\n", x->buf[0]);
        }

        PVIP_string_printf(x, "%s%d", "hoge", 2);
        if (x->len==6 && !memcmp(x->buf, "1hoge2", 6)) {
            printf("ok 2\n");
        } else {
            printf("not ok 2\n");
            printf("# len: %ld\n", x->len);
        }

        PVIP_string_destroy(x);
    }

    {
        PVIPNode *node = PVIP_parse_string(pvip, "\n", 1, 0, NULL);
        if (node) {
            printf("ok 3\n");
        } else {
            printf("not ok 3\n");
        }
    }

    pvip_free(pvip);

    return 0;
}